

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiOutAlsa::sendMessage(MidiOutAlsa *this,uchar *message,size_t size)

{
  int iVar1;
  void *pvVar2;
  string *psVar3;
  string local_110;
  string local_f0;
  string local_d0;
  char local_ac [3];
  undefined1 local_a9;
  snd_seq_event_t ev;
  uint offset;
  uint i;
  string local_58;
  uint local_34;
  undefined8 *puStack_30;
  uint nBytes;
  AlsaMidiData *data;
  long result;
  size_t size_local;
  uchar *message_local;
  MidiOutAlsa *this_local;
  
  puStack_30 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  local_34 = (uint)size;
  result = size;
  size_local = (size_t)message;
  message_local = (uchar *)this;
  if (*(uint *)(puStack_30 + 4) < local_34) {
    *(uint *)(puStack_30 + 4) = local_34;
    iVar1 = snd_midi_event_resize_buffer(puStack_30[3]);
    data = (AlsaMidiData *)(long)iVar1;
    if (data != (AlsaMidiData *)0x0) {
      psVar3 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::operator=
                ((string *)psVar3,"MidiOutAlsa::sendMessage: ALSA error resizing MIDI event buffer."
                );
      std::__cxx11::string::string((string *)&local_58,(string *)psVar3);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      return;
    }
    free((void *)puStack_30[5]);
    pvVar2 = malloc((ulong)*(uint *)(puStack_30 + 4));
    puStack_30[5] = pvVar2;
    if (puStack_30[5] == 0) {
      psVar3 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::operator=
                ((string *)psVar3,"MidiOutAlsa::initialize: error allocating buffer memory!\n\n");
      std::__cxx11::string::string((string *)&offset,(string *)psVar3);
      MidiApi::error((MidiApi *)this,MEMORY_ERROR,(string *)&offset);
      std::__cxx11::string::~string((string *)&offset);
      return;
    }
  }
  for (ev.data.control.value = 0; ev.data.raw32.d[2] < local_34;
      ev.data.control.value = ev.data.control.value + 1) {
    *(undefined1 *)(puStack_30[5] + (ulong)ev.data.raw32.d[2]) =
         *(undefined1 *)(size_local + ev.data.raw32.d[2]);
  }
  ev.data.note.duration = 0;
  do {
    if (local_34 <= ev.data.note.duration) {
      snd_seq_drain_output(*puStack_30);
      return;
    }
    memset(local_ac,0,0x1c);
    ev.time.tick._1_1_ = (undefined1)*(undefined4 *)((long)puStack_30 + 0xc);
    ev.time.tick._2_1_ = 0xfe;
    ev.time.tick._3_1_ = 0xfd;
    local_a9 = 0xfd;
    data = (AlsaMidiData *)
           snd_midi_event_encode
                     (puStack_30[3],puStack_30[5] + (ulong)ev.data.note.duration,
                      local_34 - ev.data._4_4_,local_ac);
    if ((long)data < 0) {
      psVar3 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::operator=
                ((string *)psVar3,"MidiOutAlsa::sendMessage: event parsing error!");
      std::__cxx11::string::string((string *)&local_d0,(string *)psVar3);
      MidiApi::error((MidiApi *)this,WARNING,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      return;
    }
    if (local_ac[0] == -1) {
      psVar3 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::operator=
                ((string *)psVar3,"MidiOutAlsa::sendMessage: incomplete message!");
      std::__cxx11::string::string((string *)&local_f0,(string *)psVar3);
      MidiApi::error((MidiApi *)this,WARNING,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      return;
    }
    ev.data.note.duration = ev.data.note.duration + (int)data;
    iVar1 = snd_seq_event_output(*puStack_30);
    data = (AlsaMidiData *)(long)iVar1;
  } while (-1 < (long)data);
  psVar3 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
  std::__cxx11::string::operator=
            ((string *)psVar3,"MidiOutAlsa::sendMessage: error sending MIDI message to port.");
  std::__cxx11::string::string((string *)&local_110,(string *)psVar3);
  MidiApi::error((MidiApi *)this,WARNING,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  return;
}

Assistant:

void MidiOutAlsa :: sendMessage( const unsigned char *message, size_t size )
{
  long result;
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  unsigned int nBytes = static_cast<unsigned int> (size);
  if ( nBytes > data->bufferSize ) {
    data->bufferSize = nBytes;
    result = snd_midi_event_resize_buffer( data->coder, nBytes );
    if ( result != 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: ALSA error resizing MIDI event buffer.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    free (data->buffer);
    data->buffer = (unsigned char *) malloc( data->bufferSize );
    if ( data->buffer == NULL ) {
      errorString_ = "MidiOutAlsa::initialize: error allocating buffer memory!\n\n";
      error( RtMidiError::MEMORY_ERROR, errorString_ );
      return;
    }
  }

  for ( unsigned int i=0; i<nBytes; ++i ) data->buffer[i] = message[i];

  unsigned int offset = 0;
  while (offset < nBytes) {
    snd_seq_event_t ev;
    snd_seq_ev_clear( &ev );
    snd_seq_ev_set_source( &ev, data->vport );
    snd_seq_ev_set_subs( &ev );
    snd_seq_ev_set_direct( &ev );
    result = snd_midi_event_encode( data->coder, data->buffer + offset,
                                    (long)(nBytes - offset), &ev );
    if ( result < 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: event parsing error!";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }

    if ( ev.type == SND_SEQ_EVENT_NONE ) {
      errorString_ = "MidiOutAlsa::sendMessage: incomplete message!";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }

    offset += result;

    // Send the event.
    result = snd_seq_event_output( data->seq, &ev );
    if ( result < 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: error sending MIDI message to port.";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }
  }
  snd_seq_drain_output( data->seq );
}